

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O2

void __thiscall NULLC::TraceArray<char>::TraceArray(TraceArray<char> *this,uint size)

{
  char *pcVar1;
  
  this->count = 0;
  this->max = size;
  if (size == 0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = (char *)operator_new__((ulong)size);
  }
  this->data = pcVar1;
  return;
}

Assistant:

TraceArray(unsigned size)
		{
			count = 0;
			max = size;

			if(size)
				data = new T[size];
			else
				data = NULL;
		}